

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

bool __thiscall llvm::ItaniumPartialDemangler::isCtorOrDtor(ItaniumPartialDemangler *this)

{
  byte bVar1;
  void *pvVar2;
  long lVar3;
  
  pvVar2 = this->RootNode;
  do {
    if (pvVar2 == (void *)0x0) {
      return false;
    }
    bVar1 = *(byte *)((long)pvVar2 + 8);
    lVar3 = 0x10;
    if (bVar1 < 0x18) {
      if (bVar1 != 8) {
        if ((bVar1 != 0x12) && (bVar1 != 0x17)) {
          return false;
        }
LAB_001e9edc:
        lVar3 = 0x18;
      }
    }
    else if (bVar1 < 0x21) {
      if (bVar1 == 0x18) goto LAB_001e9edc;
      if (bVar1 != 0x1f) {
        return false;
      }
    }
    else if (bVar1 != 0x21) {
      if (bVar1 != 0x24) {
        return false;
      }
      return true;
    }
    pvVar2 = *(void **)((long)pvVar2 + lVar3);
  } while( true );
}

Assistant:

bool ItaniumPartialDemangler::isCtorOrDtor() const {
  Node *N = static_cast<Node *>(RootNode);
  while (N) {
    switch (N->getKind()) {
    default:
      return false;
    case Node::KCtorDtorName:
      return true;

    case Node::KAbiTagAttr:
      N = static_cast<AbiTagAttr *>(N)->Base;
      break;
    case Node::KFunctionEncoding:
      N = static_cast<FunctionEncoding *>(N)->getName();
      break;
    case Node::KLocalName:
      N = static_cast<LocalName *>(N)->Entity;
      break;
    case Node::KNameWithTemplateArgs:
      N = static_cast<NameWithTemplateArgs *>(N)->Name;
      break;
    case Node::KNestedName:
      N = static_cast<NestedName *>(N)->Name;
      break;
    case Node::KStdQualifiedName:
      N = static_cast<StdQualifiedName *>(N)->Child;
      break;
    }
  }
  return false;
}